

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::ParseableFunctionInfo::SetSourceInfo
          (ParseableFunctionInfo *this,uint sourceIndex,ParseNodeFnc *node,bool isEval,
          bool isDynamicFunction)

{
  undefined1 *puVar1;
  byte bVar2;
  charcount_t cVar3;
  ulong uVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  Recycler *alloc;
  undefined8 *ptr;
  ulong uVar8;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  bVar2 = (this->super_FunctionProxy).field_0x47;
  if ((char)bVar2 < '\0') {
    if (this->m_sourceIndex != sourceIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb87,"(this->m_sourceIndex == sourceIndex)",
                                  "Mismatched source index");
      if (!bVar6) goto LAB_0076dce8;
      *puVar7 = 0;
    }
    if (((this->super_FunctionProxy).field_0x46 & 0x10) == 0) {
      if (node->cbMin != (ulong)this->m_cbStartOffset) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8c,"(this->StartOffset() == node->cbMin)",
                                    "Mismatched source start offset");
        if (!bVar6) goto LAB_0076dce8;
        *puVar7 = 0;
      }
      if (this->m_cchStartOffset != (node->super_ParseNode).ichMin) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8d,"(this->m_cchStartOffset == node->ichMin)",
                                    "Mismatched source character start offset");
        if (!bVar6) goto LAB_0076dce8;
        *puVar7 = 0;
      }
      if (this->m_cchLength != (node->super_ParseNode).ichLim - (node->super_ParseNode).ichMin) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8e,"(this->m_cchLength == node->LengthInCodepoints())",
                                    "Mismatched source length");
        if (!bVar6) goto LAB_0076dce8;
        *puVar7 = 0;
      }
      if (node->cbLim - node->cbMin != (ulong)this->m_cbLength) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8f,"(this->LengthInBytes() == node->LengthInBytes())",
                                    "Mismatched source encoded byte length");
        if (!bVar6) goto LAB_0076dce8;
        *puVar7 = 0;
      }
    }
    if ((bool)((this->super_FunctionProxy).field_0x47 & 1) != isEval) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb92,"(this->m_isEval == isEval)","Mismatched source type");
      if (!bVar6) goto LAB_0076dce8;
      *puVar7 = 0;
    }
    if ((((this->super_FunctionProxy).field_0x47 & 2) == 0) == isDynamicFunction) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb93,"(this->m_isDynamicFunction == isDynamicFunction)",
                                  "Mismatch source type");
      if (!bVar6) goto LAB_0076dce8;
      *puVar7 = 0;
    }
  }
  else {
    this->m_sourceIndex = sourceIndex;
    cVar3 = (node->super_ParseNode).ichMin;
    this->m_cchStartOffset = cVar3;
    this->m_cchLength = (node->super_ParseNode).ichLim - cVar3;
    this->m_lineNumber = node->lineNumber;
    this->m_columnNumber = node->columnNumber;
    (this->super_FunctionProxy).field_0x47 = isDynamicFunction * '\x02' | isEval | bVar2 & 0x7c;
    uVar4 = node->cbMin;
    uVar8 = node->cbLim - uVar4;
    if ((uVar8 | uVar4) >> 0x20 != 0) {
      Throw::OutOfMemory();
    }
    if (uVar4 < node->cbStringMin) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb70,"(node->cbStringMin <= node->cbMin)",
                                  "node->cbStringMin <= node->cbMin");
      if (!bVar6) goto LAB_0076dce8;
      *puVar7 = 0;
    }
    this->m_cbStartOffset = (Type)uVar4;
    this->m_cbLength = (Type)uVar8;
    if (node->cbStringMin != node->cbMin) {
      local_58 = (undefined1  [8])&PrintOffsets::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_2ab601b;
      data.filename._0_4_ = 0xb76;
      alloc = Memory::Recycler::TrackAllocInfo
                        (((this->super_FunctionProxy).m_scriptContext)->recycler,
                         (TrackAllocData *)local_58);
      ptr = (undefined8 *)new<Memory::Recycler>(8,alloc,0x781bfc);
      *ptr = 0;
      *(int *)ptr = (int)node->cbStringMin;
      *(int *)((long)ptr + 4) = (int)node->cbStringLim;
      FunctionProxy::SetAuxPtr(&this->super_FunctionProxy,PrintOffsets,ptr);
    }
    if ((this->super_FunctionProxy).m_utf8SourceInfo.ptr == (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb7c,"(this->m_utf8SourceInfo != nullptr)",
                                  "this->m_utf8SourceInfo != nullptr");
      if (!bVar6) goto LAB_0076dce8;
      *puVar7 = 0;
    }
    puVar1 = &(this->super_FunctionProxy).field_0x47;
    *puVar1 = *puVar1 | 0x80;
    bVar6 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar6) {
      bVar6 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar6) goto LAB_0076dce8;
        *puVar7 = 0;
      }
      Utf8SourceInfo::SetFunctionBody
                ((this->super_FunctionProxy).m_utf8SourceInfo.ptr,(FunctionBody *)this);
    }
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_015cd718,FunctionSourceInfoParsePhase);
  if (bVar6) {
    if ((((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr ==
        (FunctionProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb9a,"(this->GetFunctionInfo()->HasBody())",
                                  "this->GetFunctionInfo()->HasBody()");
      if (!bVar6) goto LAB_0076dce8;
      *puVar7 = 0;
    }
    bVar6 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar6) {
      bVar6 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar6) {
LAB_0076dce8:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar7 = 0;
      }
      FunctionBody::PrintStatementSourceLineFromStartOffset
                ((FunctionBody *)this,this->m_cchStartOffset);
      Output::Flush();
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetSourceInfo(uint sourceIndex, ParseNodeFnc * node, bool isEval, bool isDynamicFunction)
    {
        if (!m_utf8SourceHasBeenSet)
        {
            this->m_sourceIndex = sourceIndex;
            this->m_cchStartOffset = node->ichMin;
            this->m_cchLength = node->LengthInCodepoints();
            this->m_lineNumber = node->lineNumber;
            this->m_columnNumber = node->columnNumber;
            this->m_isEval = isEval;
            this->m_isDynamicFunction = isDynamicFunction;

            // It would have been better if we detect and reject large source buffer earlier before parsing
            size_t cbMin = node->cbMin;
            size_t lengthInBytes = node->LengthInBytes();
            if (cbMin > UINT_MAX || lengthInBytes > UINT_MAX)
            {
                Js::Throw::OutOfMemory();
            }
            Assert(node->cbStringMin <= node->cbMin);
            this->m_cbStartOffset = (uint)cbMin;
            this->m_cbLength = (uint)lengthInBytes;

            if (node->cbStringMin != node->cbMin)
            {
                PrintOffsets* printOffsets = RecyclerNewLeaf(this->m_scriptContext->GetRecycler(), PrintOffsets);
                printOffsets->cbStartPrintOffset = (uint)node->cbStringMin;
                printOffsets->cbEndPrintOffset = (uint)node->cbStringLim;
                this->SetPrintOffsets(printOffsets);
            }

            Assert(this->m_utf8SourceInfo != nullptr);
            this->m_utf8SourceHasBeenSet = true;

            if (this->IsFunctionBody())
            {
                this->GetFunctionBody()->FinishSourceInfo();
            }
        }
#if DBG
        else
        {
            AssertMsg(this->m_sourceIndex == sourceIndex, "Mismatched source index");
            if (!this->GetIsGlobalFunc())
            {
                // In the global function case with a @cc_on, we modify some of these values so it might
                // not match on reparse (see ParseableFunctionInfo::Parse()).
                AssertMsg(this->StartOffset() == node->cbMin, "Mismatched source start offset");
                AssertMsg(this->m_cchStartOffset == node->ichMin, "Mismatched source character start offset");
                AssertMsg(this->m_cchLength == node->LengthInCodepoints(), "Mismatched source length");
                AssertMsg(this->LengthInBytes() == node->LengthInBytes(), "Mismatched source encoded byte length");
            }

            AssertMsg(this->m_isEval == isEval, "Mismatched source type");
            AssertMsg(this->m_isDynamicFunction == isDynamicFunction, "Mismatch source type");
       }
#endif

#if DBG_DUMP
        if (PHASE_TRACE1(Js::FunctionSourceInfoParsePhase))
        {
            Assert(this->GetFunctionInfo()->HasBody());
            if (this->IsFunctionBody())
            {
                FunctionBody* functionBody = this->GetFunctionBody();
                Assert( functionBody != nullptr );

                functionBody->PrintStatementSourceLineFromStartOffset(functionBody->StartInDocument());
                Output::Flush();
            }
        }
#endif
    }